

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O3

void __thiscall
btConeTwistConstraint::getInfo2NonVirtual
          (btConeTwistConstraint *this,btConstraintInfo2 *info,btTransform *transA,
          btTransform *transB,btMatrix3x3 *invInertiaWorldA,btMatrix3x3 *invInertiaWorldB)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  uint uVar8;
  btScalar *pbVar9;
  btScalar *pbVar10;
  int iVar11;
  long lVar12;
  btScalar *pbVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  btScalar *pbVar17;
  btScalar *pbVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  btVector3 a2;
  btVector3 a1;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  calcAngleInfo2(this,transA,transB,invInertiaWorldA,invInertiaWorldB);
  pbVar9 = info->m_J1linearAxis;
  *pbVar9 = 1.0;
  iVar7 = info->rowskip;
  lVar12 = (long)iVar7;
  pbVar9[lVar12 + 1] = 1.0;
  pbVar9[lVar12 * 2 + 2] = 1.0;
  fVar21 = (this->m_rbAFrame).m_origin.m_floats[0];
  fVar20 = (this->m_rbAFrame).m_origin.m_floats[1];
  fVar25 = (this->m_rbAFrame).m_origin.m_floats[2];
  fVar23 = fVar25 * (transA->m_basis).m_el[0].m_floats[2] +
           fVar21 * (transA->m_basis).m_el[0].m_floats[0] +
           (transA->m_basis).m_el[0].m_floats[1] * fVar20;
  fVar26 = fVar25 * (transA->m_basis).m_el[1].m_floats[2] +
           fVar21 * (transA->m_basis).m_el[1].m_floats[0] +
           (transA->m_basis).m_el[1].m_floats[1] * fVar20;
  fVar21 = fVar25 * (transA->m_basis).m_el[2].m_floats[2] +
           fVar21 * (transA->m_basis).m_el[2].m_floats[0] +
           fVar20 * (transA->m_basis).m_el[2].m_floats[1];
  local_40._4_4_ = fVar26;
  local_40._0_4_ = fVar23;
  local_40._8_4_ = fVar21;
  local_40._12_4_ = 0;
  pbVar9 = info->m_J1angularAxis;
  lVar14 = 0;
  *pbVar9 = 0.0;
  pbVar9[1] = fVar21;
  pbVar9[2] = -fVar26;
  pbVar9[3] = 0.0;
  pbVar9[lVar12] = -fVar21;
  pbVar9[lVar12 + 1] = 0.0;
  pbVar9[lVar12 + 2] = fVar23;
  pbVar9[lVar12 + 3] = 0.0;
  pbVar9[lVar12 * 2] = fVar26;
  pbVar9[lVar12 * 2 + 1] = -fVar23;
  (pbVar9 + lVar12 * 2 + 2)[0] = 0.0;
  (pbVar9 + lVar12 * 2 + 2)[1] = 0.0;
  pbVar10 = info->m_J2linearAxis;
  *pbVar10 = -1.0;
  pbVar10[lVar12 + 1] = -1.0;
  pbVar10[lVar12 * 2 + 2] = -1.0;
  fVar21 = (this->m_rbBFrame).m_origin.m_floats[0];
  fVar20 = (this->m_rbBFrame).m_origin.m_floats[1];
  fVar25 = (this->m_rbBFrame).m_origin.m_floats[2];
  fVar23 = fVar25 * (transB->m_basis).m_el[0].m_floats[2] +
           fVar21 * (transB->m_basis).m_el[0].m_floats[0] +
           (transB->m_basis).m_el[0].m_floats[1] * fVar20;
  fVar26 = fVar25 * (transB->m_basis).m_el[1].m_floats[2] +
           fVar21 * (transB->m_basis).m_el[1].m_floats[0] +
           (transB->m_basis).m_el[1].m_floats[1] * fVar20;
  fVar21 = fVar25 * (transB->m_basis).m_el[2].m_floats[2] +
           fVar21 * (transB->m_basis).m_el[2].m_floats[0] +
           fVar20 * (transB->m_basis).m_el[2].m_floats[1];
  local_50._4_4_ = fVar26;
  local_50._0_4_ = fVar23;
  local_50._8_4_ = fVar21;
  local_50._12_4_ = 0;
  pbVar10 = info->m_J2angularAxis;
  *pbVar10 = 0.0;
  pbVar10[1] = -fVar21;
  pbVar10[2] = fVar26;
  pbVar10[3] = 0.0;
  pbVar10[lVar12] = fVar21;
  pbVar10[lVar12 + 1] = 0.0;
  pbVar10[lVar12 + 2] = -fVar23;
  pbVar10[lVar12 + 3] = 0.0;
  pbVar10[lVar12 * 2] = -fVar26;
  pbVar10[lVar12 * 2 + 1] = fVar23;
  (pbVar10 + lVar12 * 2 + 2)[0] = 0.0;
  (pbVar10 + lVar12 * 2 + 2)[1] = 0.0;
  uVar8 = this->m_flags;
  pbVar13 = &this->m_linERP;
  if ((uVar8 & 2) == 0) {
    pbVar13 = &info->erp;
  }
  fVar21 = *pbVar13;
  fVar20 = info->fps;
  pbVar13 = info->m_constraintError;
  pbVar17 = info->m_lowerLimit;
  pbVar18 = info->m_upperLimit;
  lVar19 = 0;
  do {
    pbVar13[lVar19] =
         (((*(float *)(local_50 + lVar14) + *(float *)((long)(transB->m_origin).m_floats + lVar14))
          - *(float *)(local_40 + lVar14)) - *(float *)((long)(transA->m_origin).m_floats + lVar14))
         * fVar21 * fVar20;
    pbVar17[lVar19] = -3.4028235e+38;
    pbVar18[lVar19] = 3.4028235e+38;
    if ((uVar8 & 1) != 0) {
      info->cfm[lVar19] = this->m_linCFM;
    }
    lVar19 = lVar19 + lVar12;
    lVar14 = lVar14 + 4;
  } while (lVar14 != 0xc);
  iVar11 = iVar7 * 3;
  if (this->m_solveSwingLimit == true) {
    fVar21 = this->m_fixThresh;
    if ((fVar21 < this->m_swingSpan1 || fVar21 == this->m_swingSpan1) ||
       (fVar21 < this->m_swingSpan2 || fVar21 == this->m_swingSpan2)) {
      fVar21 = this->m_relaxationFactor;
      fVar20 = (this->m_swingAxis).m_floats[0] * fVar21 * fVar21;
      fVar25 = (this->m_swingAxis).m_floats[1] * fVar21 * fVar21;
      fVar21 = (this->m_swingAxis).m_floats[2] * fVar21 * fVar21;
      pbVar9[iVar11] = fVar20;
      pbVar9[(long)iVar11 + 1] = fVar25;
      pbVar9[(long)iVar11 + 2] = fVar21;
      pbVar10[iVar11] = -fVar20;
      pbVar10[(long)iVar11 + 1] = -fVar25;
      pbVar10[(long)iVar11 + 2] = -fVar21;
      pbVar13[iVar11] = info->fps * this->m_biasFactor * this->m_swingCorrection;
      if ((uVar8 & 4) != 0) {
        info->cfm[iVar11] = this->m_angCFM;
      }
      pbVar17[iVar11] = 0.0;
      fVar21 = 3.4028235e+38;
      if ((this->m_bMotorEnabled == true) && (0.0 <= this->m_maxMotorImpulse)) {
        fVar21 = this->m_maxMotorImpulse;
      }
      pbVar18[iVar11] = fVar21;
      iVar11 = iVar7 << 2;
    }
    else {
      fVar21 = (transA->m_basis).m_el[0].m_floats[0];
      fVar20 = (transA->m_basis).m_el[0].m_floats[1];
      fVar25 = (transA->m_basis).m_el[0].m_floats[2];
      fVar23 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[1];
      fVar26 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[1];
      fVar1 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[2];
      fVar22 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[1];
      fVar24 = fVar22 * fVar25 + fVar26 * fVar21 + fVar20 * fVar23;
      fVar2 = (transA->m_basis).m_el[1].m_floats[0];
      fVar3 = (transA->m_basis).m_el[1].m_floats[1];
      fVar4 = (transA->m_basis).m_el[1].m_floats[2];
      fVar28 = fVar22 * fVar4 + fVar26 * fVar2 + fVar23 * fVar3;
      fVar27 = (transA->m_basis).m_el[2].m_floats[0];
      fVar5 = (transA->m_basis).m_el[2].m_floats[1];
      fVar6 = (transA->m_basis).m_el[2].m_floats[2];
      fVar22 = fVar22 * fVar6 + fVar26 * fVar27 + fVar23 * fVar5;
      fVar23 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[2];
      fVar26 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[2];
      fVar27 = fVar6 * fVar26 + fVar27 * fVar1 + fVar5 * fVar23;
      iVar15 = iVar7 * 4;
      pbVar9[lVar12 * 3] = fVar24;
      pbVar9[(long)iVar11 + 1] = fVar28;
      pbVar9[(long)iVar11 + 2] = fVar22;
      fVar21 = fVar25 * fVar26 + fVar21 * fVar1 + fVar20 * fVar23;
      fVar20 = fVar4 * fVar26 + fVar2 * fVar1 + fVar3 * fVar23;
      *(ulong *)(pbVar9 + iVar15) = CONCAT44(fVar20,fVar21);
      iVar16 = iVar7 * 4 + 2;
      pbVar9[iVar16] = fVar27;
      pbVar10[lVar12 * 3] = -fVar24;
      pbVar10[(long)iVar11 + 1] = -fVar28;
      pbVar10[(long)iVar11 + 2] = -fVar22;
      *(ulong *)(pbVar10 + iVar15) = CONCAT44(fVar20,fVar21) ^ 0x8000000080000000;
      pbVar10[iVar16] = -fVar27;
      fVar25 = info->fps * this->m_relaxationFactor;
      pbVar13[lVar12 * 3] =
           (fVar22 * (this->m_swingAxis).m_floats[2] +
           fVar24 * (this->m_swingAxis).m_floats[0] + fVar28 * (this->m_swingAxis).m_floats[1]) *
           fVar25;
      pbVar13[iVar15] =
           (fVar27 * (this->m_swingAxis).m_floats[2] +
           fVar21 * (this->m_swingAxis).m_floats[0] + fVar20 * (this->m_swingAxis).m_floats[1]) *
           fVar25;
      pbVar17 = info->m_lowerLimit;
      pbVar17[lVar12 * 3] = -3.4028235e+38;
      pbVar18 = info->m_upperLimit;
      pbVar18[lVar12 * 3] = 3.4028235e+38;
      pbVar17[iVar15] = -3.4028235e+38;
      pbVar18[iVar15] = 3.4028235e+38;
      iVar11 = iVar7 * 5;
    }
  }
  if (this->m_solveTwistLimit == true) {
    fVar21 = this->m_relaxationFactor;
    fVar20 = (this->m_twistAxis).m_floats[0] * fVar21 * fVar21;
    fVar25 = (this->m_twistAxis).m_floats[1] * fVar21 * fVar21;
    fVar21 = (this->m_twistAxis).m_floats[2] * fVar21 * fVar21;
    lVar12 = (long)iVar11;
    pbVar9[lVar12] = fVar20;
    pbVar9[lVar12 + 1] = fVar25;
    pbVar9[lVar12 + 2] = fVar21;
    pbVar10[lVar12] = -fVar20;
    pbVar10[lVar12 + 1] = -fVar25;
    pbVar10[lVar12 + 2] = -fVar21;
    info->m_constraintError[lVar12] = info->fps * this->m_biasFactor * this->m_twistCorrection;
    if ((uVar8 & 4) != 0) {
      info->cfm[lVar12] = this->m_angCFM;
    }
    if (this->m_twistSpan <= 0.0) {
      pbVar17[lVar12] = -3.4028235e+38;
    }
    else {
      if (this->m_twistCorrection <= 0.0) {
        pbVar17[lVar12] = -3.4028235e+38;
        pbVar18[lVar12] = 0.0;
        return;
      }
      pbVar17[lVar12] = 0.0;
    }
    pbVar18[lVar12] = 3.4028235e+38;
  }
  return;
}

Assistant:

void btConeTwistConstraint::getInfo2NonVirtual (btConstraintInfo2* info,const btTransform& transA,const btTransform& transB,const btMatrix3x3& invInertiaWorldA,const btMatrix3x3& invInertiaWorldB)
{
	calcAngleInfo2(transA,transB,invInertiaWorldA,invInertiaWorldB);
	
	btAssert(!m_useSolveConstraintObsolete);
    // set jacobian
    info->m_J1linearAxis[0] = 1;
    info->m_J1linearAxis[info->rowskip+1] = 1;
    info->m_J1linearAxis[2*info->rowskip+2] = 1;
	btVector3 a1 = transA.getBasis() * m_rbAFrame.getOrigin();
	{
		btVector3* angular0 = (btVector3*)(info->m_J1angularAxis);
		btVector3* angular1 = (btVector3*)(info->m_J1angularAxis+info->rowskip);
		btVector3* angular2 = (btVector3*)(info->m_J1angularAxis+2*info->rowskip);
		btVector3 a1neg = -a1;
		a1neg.getSkewSymmetricMatrix(angular0,angular1,angular2);
	}
    info->m_J2linearAxis[0] = -1;
    info->m_J2linearAxis[info->rowskip+1] = -1;
    info->m_J2linearAxis[2*info->rowskip+2] = -1;
	btVector3 a2 = transB.getBasis() * m_rbBFrame.getOrigin();
	{
		btVector3* angular0 = (btVector3*)(info->m_J2angularAxis);
		btVector3* angular1 = (btVector3*)(info->m_J2angularAxis+info->rowskip);
		btVector3* angular2 = (btVector3*)(info->m_J2angularAxis+2*info->rowskip);
		a2.getSkewSymmetricMatrix(angular0,angular1,angular2);
	}
    // set right hand side
	btScalar linERP = (m_flags & BT_CONETWIST_FLAGS_LIN_ERP) ? m_linERP : info->erp;
    btScalar k = info->fps * linERP;
    int j;
	for (j=0; j<3; j++)
    {
        info->m_constraintError[j*info->rowskip] = k * (a2[j] + transB.getOrigin()[j] - a1[j] - transA.getOrigin()[j]);
		info->m_lowerLimit[j*info->rowskip] = -SIMD_INFINITY;
		info->m_upperLimit[j*info->rowskip] = SIMD_INFINITY;
		if(m_flags & BT_CONETWIST_FLAGS_LIN_CFM)
		{
			info->cfm[j*info->rowskip] = m_linCFM;
		}
    }
	int row = 3;
    int srow = row * info->rowskip;
	btVector3 ax1;
	// angular limits
	if(m_solveSwingLimit)
	{
		btScalar *J1 = info->m_J1angularAxis;
		btScalar *J2 = info->m_J2angularAxis;
		if((m_swingSpan1 < m_fixThresh) && (m_swingSpan2 < m_fixThresh))
		{
			btTransform trA = transA*m_rbAFrame;
			btVector3 p = trA.getBasis().getColumn(1);
			btVector3 q = trA.getBasis().getColumn(2);
			int srow1 = srow + info->rowskip;
			J1[srow+0] = p[0];
			J1[srow+1] = p[1];
			J1[srow+2] = p[2];
			J1[srow1+0] = q[0];
			J1[srow1+1] = q[1];
			J1[srow1+2] = q[2];
			J2[srow+0] = -p[0];
			J2[srow+1] = -p[1];
			J2[srow+2] = -p[2];
			J2[srow1+0] = -q[0];
			J2[srow1+1] = -q[1];
			J2[srow1+2] = -q[2];
			btScalar fact = info->fps * m_relaxationFactor;
			info->m_constraintError[srow] =   fact * m_swingAxis.dot(p);
			info->m_constraintError[srow1] =  fact * m_swingAxis.dot(q);
			info->m_lowerLimit[srow] = -SIMD_INFINITY;
			info->m_upperLimit[srow] = SIMD_INFINITY;
			info->m_lowerLimit[srow1] = -SIMD_INFINITY;
			info->m_upperLimit[srow1] = SIMD_INFINITY;
			srow = srow1 + info->rowskip;
		}
		else
		{
			ax1 = m_swingAxis * m_relaxationFactor * m_relaxationFactor;
			J1[srow+0] = ax1[0];
			J1[srow+1] = ax1[1];
			J1[srow+2] = ax1[2];
			J2[srow+0] = -ax1[0];
			J2[srow+1] = -ax1[1];
			J2[srow+2] = -ax1[2];
			btScalar k = info->fps * m_biasFactor;

			info->m_constraintError[srow] = k * m_swingCorrection;
			if(m_flags & BT_CONETWIST_FLAGS_ANG_CFM)
			{
				info->cfm[srow] = m_angCFM;
			}
			// m_swingCorrection is always positive or 0
			info->m_lowerLimit[srow] = 0;
			info->m_upperLimit[srow] = (m_bMotorEnabled && m_maxMotorImpulse >= 0.0f) ? m_maxMotorImpulse : SIMD_INFINITY;
			srow += info->rowskip;
		}
	}
	if(m_solveTwistLimit)
	{
		ax1 = m_twistAxis * m_relaxationFactor * m_relaxationFactor;
		btScalar *J1 = info->m_J1angularAxis;
		btScalar *J2 = info->m_J2angularAxis;
		J1[srow+0] = ax1[0];
		J1[srow+1] = ax1[1];
		J1[srow+2] = ax1[2];
		J2[srow+0] = -ax1[0];
		J2[srow+1] = -ax1[1];
		J2[srow+2] = -ax1[2];
		btScalar k = info->fps * m_biasFactor;
		info->m_constraintError[srow] = k * m_twistCorrection;
		if(m_flags & BT_CONETWIST_FLAGS_ANG_CFM)
		{
			info->cfm[srow] = m_angCFM;
		}
		if(m_twistSpan > 0.0f)
		{

			if(m_twistCorrection > 0.0f)
			{
				info->m_lowerLimit[srow] = 0;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			} 
			else
			{
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = 0;
			} 
		}
		else
		{
			info->m_lowerLimit[srow] = -SIMD_INFINITY;
			info->m_upperLimit[srow] = SIMD_INFINITY;
		}
		srow += info->rowskip;
	}
}